

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseAssetIdentifier
          (AsciiParser *this,AssetPath *out,bool *triple_deliminated)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  bool bVar6;
  char s;
  string tok;
  vector<char,_std::allocator<char>_> buf;
  char c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream ss_e;
  
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  uVar1 = this->_sr->idx_;
  bVar2 = SkipWhitespaceAndNewline(this,true);
  if (bVar2) {
    bVar2 = CharN(this,3,&buf);
    if ((((bVar2) &&
         (*buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start == '@')) &&
        (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start[1] == '@')) &&
       (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
        [2] == '@')) {
      tok._M_dataplus._M_p = (pointer)&tok.field_2;
      tok._M_string_length = 0;
      tok.field_2._M_local_buf[0] = '\0';
      iVar5 = 0;
      bVar2 = false;
      while (bVar3 = bVar2, bVar2 = Eof(this), !bVar2) {
        bVar2 = Char1(this,&c);
        if (!bVar2) goto LAB_002956bf;
        bVar6 = c == '\\';
        if (c == '@') {
          iVar5 = iVar5 + 1;
        }
        else {
          if (iVar5 < 2) {
            iVar5 = 1;
          }
          iVar5 = iVar5 + -1;
        }
        ::std::__cxx11::string::push_back((char)&tok);
        bVar2 = (bool)(bVar6 | bVar3);
        if (iVar5 == 3) {
          if (!bVar6 && !bVar3) {
            ::std::__cxx11::string::string((string *)&local_1c8,"@@@",(allocator *)&s);
            removeSuffix((string *)&c,&tok,(string *)&local_1c8);
            tinyusdz::value::AssetPath::AssetPath((AssetPath *)&ss_e,(string *)&c);
            tinyusdz::value::AssetPath::operator=(out,(AssetPath *)&ss_e);
            tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            *triple_deliminated = true;
            goto LAB_0029581a;
          }
          iVar5 = 0;
          bVar2 = false;
          if (3 < tok._M_string_length) {
            ::std::__cxx11::string::string((string *)&ss_e,"\\@@@",(allocator *)&local_1c8);
            bVar3 = endsWith(&tok,(string *)&ss_e);
            ::std::__cxx11::string::_M_dispose();
            iVar5 = 0;
            bVar2 = false;
            if (bVar3) {
              ::std::__cxx11::string::erase((ulong)&tok,tok._M_string_length - 4);
              ::std::__cxx11::string::append((char *)&tok);
              bVar2 = false;
            }
          }
        }
      }
LAB_002956b5:
      bVar2 = true;
      bVar3 = false;
      goto LAB_0029581f;
    }
    if (uVar1 <= this->_sr->length_) {
      this->_sr->idx_ = uVar1;
    }
    bVar2 = Char1(this,&s);
    if (bVar2) {
      if (((byte)s - 0x22 < 0x1f) && ((0x40000021U >> ((byte)s - 0x22 & 0x1f) & 1) != 0)) {
        tok._M_dataplus._M_p = (pointer)&tok.field_2;
        tok._M_string_length = 0;
        tok.field_2._M_local_buf[0] = '\0';
        while (bVar2 = Eof(this), !bVar2) {
          bVar2 = Char1(this,(char *)&ss_e);
          if (!bVar2) goto LAB_002956bf;
          if (ss_e == (ostringstream)s) {
            tinyusdz::value::AssetPath::AssetPath((AssetPath *)&ss_e,&tok);
            tinyusdz::value::AssetPath::operator=(out,(AssetPath *)&ss_e);
            tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&ss_e);
            *triple_deliminated = false;
LAB_0029581a:
            bVar3 = true;
            bVar2 = true;
            goto LAB_0029581f;
          }
          ::std::__cxx11::string::push_back((char)&tok);
        }
        goto LAB_002956b5;
      }
      tok._M_dataplus._M_p = (pointer)&tok.field_2;
      tok.field_2._M_local_buf[0] = s;
      tok._M_string_length = 1;
      tok.field_2._M_local_buf[1] = '\0';
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar4 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ParseAssetIdentifier");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x96e);
      ::std::operator<<(poVar4," ");
      ::std::operator+(&local_1c8,"Asset must start with \'@\', \'\'\' or \'\"\', but got \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tok);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                       &local_1c8,"\'");
      poVar4 = ::std::operator<<((ostream *)&ss_e,(string *)&c);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&c);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
    }
  }
  goto LAB_0029582e;
LAB_002956bf:
  bVar3 = false;
  bVar2 = false;
LAB_0029581f:
  ::std::__cxx11::string::_M_dispose();
  if (bVar2) goto LAB_00295830;
LAB_0029582e:
  bVar3 = false;
LAB_00295830:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            ((_Vector_base<char,_std::allocator<char>_> *)&buf);
  return bVar3;
}

Assistant:

bool AsciiParser::ParseAssetIdentifier(value::AssetPath *out,
                                       bool *triple_deliminated) {
  // '..' or "..." are also allowed.
  // @...@
  // or @@@...@@@ (Triple '@'-deliminated asset identifier.)
  // @@@ = Path containing '@'. '@@@' in Path is encoded as '\@@@'
  //
  // Example:
  //   @bora@
  //   @@@bora@@@
  //   @@@bora\@@@dora@@@

  // TODO: Correctly support escape characters

  // look ahead.
  std::vector<char> buf;
  uint64_t curr = _sr->tell();
  bool maybe_triple{false};

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  if (CharN(3, &buf)) {
    if (buf[0] == '@' && buf[1] == '@' && buf[2] == '@') {
      maybe_triple = true;
    }
  }

  bool valid{false};

  if (!maybe_triple) {
    // delimiter = " ' @

    SeekTo(curr);
    char s;
    if (!Char1(&s)) {
      return false;
    }

    char delim = s;

    if ((s == '@') || (s == '\'') || (s == '"')) {
      // ok
    } else {
      std::string sstr{s};
      PUSH_ERROR_AND_RETURN(
          "Asset must start with '@', '\'' or '\"', but got '" + sstr + "'");
    }

    std::string tok;

    // Read until next delimiter
    bool found_delimiter = false;
    while (!Eof()) {
      char c;

      if (!Char1(&c)) {
        return false;
      }

      if (c == delim) {
        found_delimiter = true;
        break;
      }

      tok += c;
    }

    if (found_delimiter) {
      (*out) = tok;
      (*triple_deliminated) = false;

      valid = true;
    }

  } else {
    bool found_delimiter{false};
    bool escape_sequence{false};
    int at_cnt{0};
    std::string tok;

    // Read until '@@@' appears
    // Need to escaped '@@@'("\\@@@")
    while (!Eof()) {
      char c;

      if (!Char1(&c)) {
        return false;
      }

      if (c == '\\') {
        escape_sequence = true;
      }

      if (c == '@') {
        at_cnt++;
      } else {
        at_cnt--;
        if (at_cnt < 0) {
          at_cnt = 0;
        }
      }

      tok += c;

      if (at_cnt == 3) {
        if (escape_sequence) {
          // Still in path identifier...
          // Unescape "\\@@@"

          if (tok.size() > 3) {            // this should be true.
            if (endsWith(tok, "\\@@@")) {  // this also should be true.
              tok.erase(tok.size() - 4);
              tok.append("@@@");
            }
          }
          at_cnt = 0;
          escape_sequence = false;
        } else {
          // Got it. '@@@'
          found_delimiter = true;
          break;
        }
      }
    }

    if (found_delimiter) {
      // remote last '@@@'
      (*out) = removeSuffix(tok, "@@@");
      (*triple_deliminated) = true;

      valid = true;
    }
  }

  return valid;
}